

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall HPresolve::rowDualBoundsDominatedColumns(HPresolve *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<double,_std::allocator<double>_> *this_03;
  vector<double,_std::allocator<double>_> *this_04;
  vector<double,_std::allocator<double>_> *this_05;
  double dVar1;
  double dVar2;
  int j;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  _List_node_base *p_Var7;
  size_type __n;
  vector<double,_std::allocator<double>_> *this_06;
  size_type __n_00;
  size_type __n_01;
  double local_98;
  
  this_00 = &(this->super_HPreData).colLower;
  this_03 = &(this->super_HPreData).colUpper;
  this_01 = &(this->super_HPreData).colCost;
  this_02 = &(this->super_HPreData).Avalue;
  this_04 = &this->implRowDualLower;
  this_05 = &this->implRowDualUpper;
  p_Var7 = (_List_node_base *)&this->singCol;
LAB_00140277:
  do {
    do {
      p_Var7 = (((_List_base<int,_std::allocator<int>_> *)&p_Var7->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      if (p_Var7 == (_List_node_base *)&this->singCol) {
        return;
      }
      pvVar4 = std::vector<int,_std::allocator<int>_>::at
                         (&(this->super_HPreData).flagCol,(long)*(int *)&p_Var7[1]._M_next);
    } while (*pvVar4 == 0);
    j = *(int *)&p_Var7[1]._M_next;
    iVar3 = getSingColElementIndexInA(this,j);
    __n_01 = (size_type)iVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).Aindex,__n_01);
    iVar3 = *pvVar4;
    __n = (size_type)iVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).flagRow,__n);
    if (*pvVar4 == 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"ERROR: column singleton ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,j);
      poVar6 = std::operator<<(poVar6," is in row ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      std::operator<<(poVar6," which is already mapped off\n");
      exit(-1);
    }
    __n_00 = (size_type)j;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_00,__n_00);
    if ((*pvVar5 != -1e+200) || (NAN(*pvVar5))) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_03,__n_00);
      if ((*pvVar5 != 1e+200) || (NAN(*pvVar5))) goto LAB_00140277;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_00,__n_00);
    if (*pvVar5 <= -1e+200) {
LAB_00140472:
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_00,__n_00);
      if ((*pvVar5 != -1e+200) ||
         ((NAN(*pvVar5) ||
          (pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_03,__n_00),
          1e+200 < *pvVar5 || *pvVar5 == 1e+200)))) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_00,__n_00);
        if ((*pvVar5 == -1e+200) && (!NAN(*pvVar5))) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_03,__n_00);
          if ((*pvVar5 == 1e+200) && (!NAN(*pvVar5))) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n_00);
            dVar1 = *pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
            dVar2 = *pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_04,__n);
            if (*pvVar5 <= dVar1 / dVar2 && dVar1 / dVar2 != *pvVar5) {
              pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n_00);
              dVar1 = *pvVar5;
              pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
              dVar2 = *pvVar5;
              pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_04,__n);
              *pvVar5 = dVar1 / dVar2;
            }
            goto LAB_00140667;
          }
        }
      }
      else {
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
        if (0.0 < *pvVar5) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n_00);
          dVar1 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
          dVar2 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_04,__n);
          if (*pvVar5 <= dVar1 / dVar2 && dVar1 / dVar2 != *pvVar5) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n_00);
            local_98 = -*pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
            dVar1 = *pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_05,__n);
            *pvVar5 = local_98 / dVar1;
          }
        }
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
        if (*pvVar5 <= 0.0 && *pvVar5 != 0.0) {
LAB_00140667:
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n_00);
          dVar1 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
          dVar2 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_05,__n);
          this_06 = this_05;
          if (dVar1 / dVar2 < *pvVar5) goto LAB_001406ae;
        }
      }
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_03,__n_00);
      if ((*pvVar5 != 1e+200) || (NAN(*pvVar5))) goto LAB_00140472;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
      if (0.0 < *pvVar5) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n_00);
        dVar1 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
        dVar2 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_05,__n);
        if (dVar1 / dVar2 < *pvVar5) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n_00);
          dVar1 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
          dVar2 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_05,__n);
          *pvVar5 = dVar1 / dVar2;
        }
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
      if (0.0 < *pvVar5 || *pvVar5 == 0.0) goto LAB_001406f3;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n_00);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
      dVar2 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_04,__n);
      this_06 = this_04;
      if (dVar1 / dVar2 < *pvVar5 || dVar1 / dVar2 == *pvVar5) goto LAB_001406f3;
LAB_001406ae:
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n_00);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
      dVar2 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_06,__n);
      *pvVar5 = dVar1 / dVar2;
    }
LAB_001406f3:
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_04,__n);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_05,__n);
    if (*pvVar5 <= dVar1 && dVar1 != *pvVar5) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "Error: inconstistent bounds for Lagrange multiplier for row ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6," detected after column singleton ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,j);
      poVar6 = std::operator<<(poVar6,". In presolve::dominatedColumns");
      std::endl<char,std::char_traits<char>>(poVar6);
      exit(0);
    }
  } while( true );
}

Assistant:

void HPresolve::rowDualBoundsDominatedColumns() {
	int col, i, k;

	//for each row calc yihat and yibar and store in implRowDualLower and implRowDualUpper
	for (list<int>::iterator it = singCol.begin(); it != singCol.end(); ++it)
		if (flagCol.at(*it)) {
			col = *it;
			k = getSingColElementIndexInA(col);
			i = Aindex.at(k);

			if (!flagRow.at(i)) {
				cout<<"ERROR: column singleton "<<col<<" is in row "<<i<<" which is already mapped off\n";
				exit(-1);
			}

			if (colLower.at(col) == -HSOL_CONST_INF || colUpper.at(col) == HSOL_CONST_INF) {

				if (colLower.at(col) > -HSOL_CONST_INF && colUpper.at(col) == HSOL_CONST_INF)  {
					if (Avalue.at(k)>0)
						if ((colCost.at(col)/Avalue.at(k)) < implRowDualUpper.at(i))
							implRowDualUpper.at(i) = colCost.at(col)/Avalue.at(k);
					if (Avalue.at(k)<0)
						if ((colCost.at(col)/Avalue.at(k)) > implRowDualLower.at(i))
							implRowDualLower.at(i) = colCost.at(col)/Avalue.at(k);
				}
				else if (colLower.at(col) == -HSOL_CONST_INF && colUpper.at(col) < HSOL_CONST_INF) {
					if (Avalue.at(k)>0)
						if ((colCost.at(col)/Avalue.at(k)) > implRowDualLower.at(i))
							implRowDualUpper.at(i) = -colCost.at(col)/Avalue.at(k);
					if (Avalue.at(k)<0)
						if ((colCost.at(col)/Avalue.at(k)) < implRowDualUpper.at(i))
							implRowDualUpper.at(i) = colCost.at(col)/Avalue.at(k);
				}
				else if (colLower.at(col) == -HSOL_CONST_INF && colUpper.at(col) == HSOL_CONST_INF) {
					//all should be removed earlier but use them
					if ((colCost.at(col)/Avalue.at(k)) > implRowDualLower.at(i))
							implRowDualLower.at(i) = colCost.at(col)/Avalue.at(k);
					if ((colCost.at(col)/Avalue.at(k)) < implRowDualUpper.at(i))
							implRowDualUpper.at(i) = colCost.at(col)/Avalue.at(k);
				}

				if (implRowDualLower.at(i) > implRowDualUpper.at(i)) {
					cout<<"Error: inconstistent bounds for Lagrange multiplier for row "<< i<< " detected after column singleton "<<col<<". In presolve::dominatedColumns"<<endl;
					exit(0);
				}
			}
		}

}